

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O0

LayoutBindingTestResult * __thiscall
glcts::LayoutBindingBaseCase::binding_array_size
          (LayoutBindingTestResult *__return_storage_ptr__,LayoutBindingBaseCase *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  reference piVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar5;
  LayoutBindingProgram *pLVar6;
  ulong uVar7;
  reference pvVar8;
  mapped_type_conflict *pmVar9;
  char *pcVar10;
  bool passed_00;
  String local_6e0;
  int *local_6c0;
  allocator<char> local_6b1;
  String local_6b0;
  String local_690;
  int local_66c;
  undefined1 local_668 [4];
  int idx_2;
  undefined1 local_650 [8];
  StringIntMap bindingPoints;
  string local_600 [32];
  string local_5e0 [32];
  string local_5c0 [32];
  string *local_5a0;
  String *u;
  undefined1 local_578 [8];
  ostringstream texUnitStr;
  undefined1 local_3f8 [4];
  int idx_1;
  StringVector list;
  String local_3d8;
  LayoutBindingProgramAutoPtr local_3b8;
  LayoutBindingProgramAutoPtr program;
  string local_390 [32];
  string local_370 [36];
  uint local_34c;
  undefined1 local_348 [4];
  int idx;
  StringStream s;
  String local_1b0;
  allocator<char> local_189;
  string local_188 [32];
  string local_168 [32];
  String local_148;
  string local_128 [32];
  String local_108;
  allocator<char> local_e1;
  String local_e0;
  String local_c0;
  allocator<char> local_9d [13];
  String local_90;
  undefined1 local_70 [8];
  String decl;
  iterator iStack_48;
  int arraySize;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_40;
  iterator it;
  vector<int,_std::allocator<int>_> arraySizes;
  bool passed;
  LayoutBindingBaseCase *this_local;
  
  passed_00 = true;
  iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x21])();
  makeSparseRange((vector<int,_std::allocator<int>_> *)&it,this,iVar2,1);
  local_40._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)&it);
  while( true ) {
    iStack_48 = std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)&it);
    bVar1 = __gnu_cxx::operator<(&local_40,&stack0xffffffffffffffb8);
    if (!bVar1) break;
    piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_40);
    decl.field_2._12_4_ = *piVar4;
    iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])();
    pcVar10 = *(char **)CONCAT44(extraout_var,iVar2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,pcVar10,local_9d);
    iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x20])();
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1a])
              (&local_c0,this,(ulong)(uint)(~decl.field_2._12_4_ + iVar2));
    iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])();
    pcVar10 = *(char **)(CONCAT44(extraout_var_00,iVar2) + 0x18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,pcVar10,&local_e1);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(local_128,this,0);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1c])
              (&local_108,this,local_128);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(local_168,this,0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_188,"float",&local_189);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1d])
              (&local_148,this,local_168,local_188);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(&local_1b0,this,0);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1e])
              (&s.super_ostringstream.field_0x170,this,(ulong)(uint)decl.field_2._12_4_);
    buildUniformDecl((String *)local_70,this,&local_90,&local_c0,&local_e0,&local_108,&local_148,
                     &local_1b0,(String *)&s.super_ostringstream.field_0x170);
    std::__cxx11::string::~string((string *)&s.super_ostringstream.field_0x170);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string(local_188);
    std::allocator<char>::~allocator(&local_189);
    std::__cxx11::string::~string(local_168);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string(local_128);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator(&local_e1);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator(local_9d);
    setTemplateParam(this,"UNIFORM_DECL",(String *)local_70);
    StringStream::StringStream((StringStream *)local_348);
    for (local_34c = 0; (int)local_34c < (int)decl.field_2._12_4_; local_34c = local_34c + 1) {
      pcVar10 = "";
      if (local_34c != 0) {
        pcVar10 = " + ";
      }
      poVar5 = std::operator<<((ostream *)local_348,pcVar10);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1f])
                (local_390,this,0,(ulong)local_34c);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1b])
                (local_370,this,local_390);
      std::operator<<(poVar5,local_370);
      std::__cxx11::string::~string(local_370);
      std::__cxx11::string::~string(local_390);
    }
    std::operator<<((ostream *)local_348,";\n");
    std::__cxx11::ostringstream::str();
    setTemplateParam(this,"UNIFORM_ACCESS",(String *)&program);
    std::__cxx11::string::~string((string *)&program);
    updateTemplate(this);
    LayoutBindingProgram::LayoutBindingProgramAutoPtr::LayoutBindingProgramAutoPtr
              (&local_3b8,&this->super_IProgramContextSupplier);
    pLVar6 = LayoutBindingProgram::LayoutBindingProgramAutoPtr::operator->(&local_3b8);
    bVar1 = LayoutBindingProgram::compiledAndLinked(pLVar6);
    passed_00 = (passed_00 & bVar1) != 0;
    if (passed_00) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_3f8);
      for (texUnitStr._372_4_ = 0; (int)texUnitStr._372_4_ < (int)decl.field_2._12_4_;
          texUnitStr._372_4_ = texUnitStr._372_4_ + 1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_578);
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(&u,this,0);
        std::operator<<((ostream *)local_578,(string *)&u);
        std::__cxx11::string::~string((string *)&u);
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])
                  (local_5e0,this,0);
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1c])
                  (local_5c0,this,local_5e0);
        std::__cxx11::string::~string(local_5e0);
        local_5a0 = local_5c0;
        uVar7 = std::__cxx11::string::empty();
        if ((uVar7 & 1) == 0) {
          std::operator<<((ostream *)local_578,"_block");
        }
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1e])
                  (local_600,this,(ulong)(uint)texUnitStr._372_4_);
        std::operator<<((ostream *)local_578,local_600);
        std::__cxx11::string::~string(local_600);
        std::__cxx11::ostringstream::str();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_3f8,
                    (value_type *)&bindingPoints._M_t._M_impl.super__Rb_tree_header._M_node_count);
        std::__cxx11::string::~string
                  ((string *)&bindingPoints._M_t._M_impl.super__Rb_tree_header._M_node_count);
        std::__cxx11::string::~string(local_5c0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_578);
      }
      pLVar6 = LayoutBindingProgram::LayoutBindingProgramAutoPtr::operator->(&local_3b8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_668,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_3f8);
      (*pLVar6->_vptr_LayoutBindingProgram[3])(local_650,pLVar6,local_668);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_668);
      for (local_66c = 0; local_66c < (int)decl.field_2._12_4_; local_66c = local_66c + 1) {
        iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x20])();
        iVar2 = (iVar2 - decl.field_2._12_4_) + -1 + local_66c;
        pvVar8 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_3f8,(long)local_66c);
        pmVar9 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                               *)local_650,pvVar8);
        passed_00 = (bool)(passed_00 & iVar2 == *pmVar9);
        if (!passed_00) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_6b0,"binding point did not match default",&local_6b1);
          pvVar8 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_3f8,(long)local_66c);
          pmVar9 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                 *)local_650,pvVar8);
          iVar2 = *pmVar9;
          iVar3 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x20])();
          generateLog<int,int>
                    (&local_690,this,&local_6b0,iVar2,(iVar3 - decl.field_2._12_4_) + -1 + local_66c
                    );
          LayoutBindingTestResult::LayoutBindingTestResult
                    (__return_storage_ptr__,passed_00,&local_690,false);
          std::__cxx11::string::~string((string *)&local_690);
          std::__cxx11::string::~string((string *)&local_6b0);
          std::allocator<char>::~allocator(&local_6b1);
          list.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
          goto LAB_013a9267;
        }
      }
      list.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
LAB_013a9267:
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              *)local_650);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_3f8);
    }
    else {
      pLVar6 = LayoutBindingProgram::LayoutBindingProgramAutoPtr::operator->(&local_3b8);
      LayoutBindingProgram::getErrorLog_abi_cxx11_(&local_3d8,pLVar6,false);
      LayoutBindingTestResult::LayoutBindingTestResult
                (__return_storage_ptr__,passed_00,&local_3d8,false);
      std::__cxx11::string::~string((string *)&local_3d8);
      list.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    }
    LayoutBindingProgram::LayoutBindingProgramAutoPtr::~LayoutBindingProgramAutoPtr(&local_3b8);
    StringStream::~StringStream((StringStream *)local_348);
    std::__cxx11::string::~string((string *)local_70);
    if (list.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != 0) goto LAB_013a937c;
    local_6c0 = (int *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                       ::operator++(&local_40,0);
  }
  std::__cxx11::string::string((string *)&local_6e0);
  LayoutBindingTestResult::LayoutBindingTestResult
            (__return_storage_ptr__,passed_00,&local_6e0,false);
  std::__cxx11::string::~string((string *)&local_6e0);
  list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
LAB_013a937c:
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&it);
  return __return_storage_ptr__;
}

Assistant:

LayoutBindingTestResult LayoutBindingBaseCase::binding_array_size(void)
{
	bool passed = true;

	std::vector<int> arraySizes = makeSparseRange(maxArraySize(), 1);
	for (std::vector<int>::iterator it = arraySizes.begin(); it < arraySizes.end(); it++)
	{
		int	arraySize = *it;
		String decl =
			buildUniformDecl(String(getTestParameters().keyword), buildLayout(maxBindings() - arraySize - 1),
							 String(getTestParameters().uniform_type), buildBlockName(getDefaultUniformName()),
							 buildBlock(getDefaultUniformName()), getDefaultUniformName(), buildArray(arraySize));
		setTemplateParam("UNIFORM_DECL", decl);

		StringStream s;
		for (int idx = 0; idx < arraySize; idx++)
		{
			s << (idx ? " + " : "") << buildAccess(buildArrayAccess(0, idx));
		}
		s << ";\n";
		setTemplateParam("UNIFORM_ACCESS", s.str());
		updateTemplate();

		LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
		passed &= program->compiledAndLinked();
		if (!passed)
		{
			return LayoutBindingTestResult(passed, program->getErrorLog());
		}

		StringVector list;
		for (int idx = 0; idx < arraySize; idx++)
		{
			std::ostringstream texUnitStr;
			texUnitStr << getDefaultUniformName();
			const String& u = buildBlockName(getDefaultUniformName());
			if (!u.empty())
				texUnitStr << "_block";
			texUnitStr << buildArray(idx);
			list.push_back(texUnitStr.str());
		}

		StringIntMap bindingPoints = program->getBindingPoints(list);
		for (int idx = 0; idx < arraySize; idx++)
		{
			passed &= (((maxBindings() - arraySize - 1) + idx) == bindingPoints[list[idx]]);
			if (!passed)
			{
				return LayoutBindingTestResult(passed, generateLog(String("binding point did not match default"),
																   bindingPoints[list[idx]],
																   (maxBindings() - arraySize - 1) + idx));
			}
		}
	}

	return LayoutBindingTestResult(passed, String());
}